

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

int __thiscall QFileSystemModel::remove(QFileSystemModel *this,char *__filename)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool success;
  QFileSystemModelPrivate *d;
  QFileInfo fileInfo;
  QString path;
  undefined1 local_4b;
  QDir local_30 [8];
  undefined1 *local_28;
  undefined1 *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFileSystemModel *)0xaa28ca);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath
            ((QFileSystemModelPrivate *)&DAT_aaaaaaaaaaaaaaaa,(QModelIndex *)&DAT_aaaaaaaaaaaaaaaa);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_28,(QString *)&local_20);
  uVar3 = QFileInfo::isFile();
  bVar2 = false;
  if (((uVar3 & 1) == 0) && (uVar3 = QFileInfo::isSymLink(), (uVar3 & 1) == 0)) {
    QDir::QDir(local_30,(QString *)&local_20);
    bVar2 = true;
    local_4b = QDir::removeRecursively();
  }
  else {
    local_4b = QFile::remove((QString *)&local_20);
  }
  if (bVar2) {
    QDir::~QDir(local_30);
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_28);
  QString::~QString((QString *)0xaa29b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_4b) & 0xffffff01;
}

Assistant:

bool QFileSystemModel::remove(const QModelIndex &aindex)
{
    Q_D(QFileSystemModel);

    const QString path = d->filePath(aindex);
    const QFileInfo fileInfo(path);
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to deletion to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(aindex);
#endif // filesystemwatcher && Q_OS_WIN
    const bool success = (fileInfo.isFile() || fileInfo.isSymLink())
            ? QFile::remove(path) : QDir(path).removeRecursively();
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    if (!success)
        d->watchPaths(watchedPaths);
#endif // filesystemwatcher && Q_OS_WIN
    return success;
}